

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O2

Aig_Man_t * Iso_ManFilterPos(Aig_Man_t *pAig,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  uint uVar1;
  Vec_Ptr_t *p;
  int iVar2;
  int Entry;
  abctime aVar3;
  Aig_Man_t *pAVar4;
  abctime aVar5;
  Aig_Man_t *pMan;
  Vec_Str_t *pVVar6;
  Vec_Ptr_t *p_00;
  Vec_Int_t *pVVar7;
  Vec_Str_t *p2;
  void *pvVar8;
  Vec_Int_t *p_01;
  abctime extraout_RDX;
  abctime extraout_RDX_00;
  abctime time;
  abctime time_00;
  abctime time_01;
  char *pStr;
  ulong uVar9;
  char *pStr_00;
  ulong uVar10;
  int local_6c;
  char *local_68;
  Vec_Ptr_t *local_60;
  int local_54;
  Aig_Man_t *local_50;
  int local_44;
  Vec_Ptr_t **local_40;
  char *local_38;
  
  local_54 = fVerbose;
  Abc_Clock();
  *pvPosEquivs = (Vec_Ptr_t *)0x0;
  local_44 = pAig->nObjs[3] - pAig->nRegs;
  local_50 = pAig;
  local_40 = pvPosEquivs;
  local_60 = Vec_PtrAlloc(local_44);
  local_6c = 0;
  pStr_00 = (char *)0x0;
  pStr = (char *)0x0;
  local_68 = (char *)0x0;
  aVar3 = extraout_RDX;
  while( true ) {
    if (local_44 <= local_6c) break;
    local_38 = pStr;
    if (local_6c % 100 == 0) {
      printf("%6d finished...\r");
    }
    aVar3 = Abc_Clock();
    pAVar4 = Saig_ManDupCones(local_50,&local_6c,1);
    aVar5 = Abc_Clock();
    pStr_00 = pStr_00 + (aVar5 - aVar3);
    aVar3 = Abc_Clock();
    pMan = Saig_ManDupIsoCanonical(pAVar4,0);
    aVar5 = Abc_Clock();
    local_68 = local_68 + (aVar5 - aVar3);
    aVar3 = Abc_Clock();
    pVVar6 = Ioa_WriteAigerIntoMemoryStr(pMan);
    aVar5 = Abc_Clock();
    pStr = local_38 + (aVar5 - aVar3);
    Vec_PtrPush(local_60,pVVar6);
    Aig_ManStop(pMan);
    Aig_ManStop(pAVar4);
    pVVar6->nCap = local_6c;
    local_6c = local_6c + 1;
    aVar3 = extraout_RDX_00;
  }
  if (local_54 != 0) {
    Abc_PrintTime(0x7a55e5,pStr_00,aVar3);
    Abc_PrintTime(0x7a55f4,local_68,time);
    Abc_PrintTime(0x7a5603,pStr,time_00);
  }
  Abc_Clock();
  p = local_60;
  Vec_PtrSort(local_60,Iso_StoCompareVecStr);
  local_68 = (char *)Abc_Clock();
  p_00 = Vec_PtrAlloc(local_50->nTruePos);
  pVVar7 = Vec_IntAlloc(4);
  Vec_PtrPush(p_00,pVVar7);
  pVVar6 = (Vec_Str_t *)Vec_PtrEntry(p,0);
  Vec_IntPush(pVVar7,pVVar6->nCap);
  uVar1 = p->nSize;
  local_6c = 1;
  while( true ) {
    if ((int)uVar1 <= local_6c) {
      uVar10 = 0;
      uVar9 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar9 = uVar10;
      }
      for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        if ((Vec_Ptr_t *)local_60->pArray[uVar10] != (Vec_Ptr_t *)0x0) {
          Vec_PtrFree((Vec_Ptr_t *)local_60->pArray[uVar10]);
        }
      }
      Vec_PtrFree(local_60);
      if (local_54 != 0) {
        aVar3 = Abc_Clock();
        Abc_PrintTime(0x7a5612,(char *)(aVar3 - (long)local_68),time_01);
      }
      iVar2 = p_00->nSize;
      for (local_6c = 0; local_6c < iVar2; local_6c = local_6c + 1) {
        pvVar8 = Vec_PtrEntry(p_00,local_6c);
        qsort(*(void **)((long)pvVar8 + 8),(long)*(int *)((long)pvVar8 + 4),4,Vec_IntSortCompare1);
      }
      qsort(p_00->pArray,(long)iVar2,8,Vec_VecSortCompare3);
      pVVar7 = Vec_IntAlloc(100);
      for (local_6c = 0; local_6c < iVar2; local_6c = local_6c + 1) {
        p_01 = (Vec_Int_t *)Vec_PtrEntry(p_00,local_6c);
        Entry = Vec_IntEntry(p_01,0);
        Vec_IntPush(pVVar7,Entry);
      }
      pAVar4 = Saig_ManDupCones(local_50,pVVar7->pArray,pVVar7->nSize);
      Vec_IntFree(pVVar7);
      *local_40 = p_00;
      return pAVar4;
    }
    p2 = (Vec_Str_t *)Vec_PtrEntry(local_60,local_6c);
    iVar2 = Vec_StrCompareVec(pVVar6,p2);
    if (iVar2 != 0) {
      pVVar7 = Vec_IntAlloc(4);
      Vec_PtrPush(p_00,pVVar7);
    }
    if ((long)p_00->nSize < 1) break;
    Vec_IntPush((Vec_Int_t *)p_00->pArray[(long)p_00->nSize + -1],p2->nCap);
    local_6c = local_6c + 1;
    pVVar6 = p2;
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
}

Assistant:

Aig_Man_t * Iso_ManFilterPos( Aig_Man_t * pAig, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{
//    int fVeryVerbose = 0;
    Aig_Man_t * pPart, * pTemp;
    Vec_Ptr_t * vBuffers, * vClasses;
    Vec_Int_t * vLevel, * vRemain;
    Vec_Str_t * vStr, * vPrev;
    int i, nPos;
    abctime clk = Abc_Clock();
    abctime clkDup = 0, clkAig = 0, clkIso = 0, clk2;
    *pvPosEquivs = NULL;

    // derive AIG for each PO
    nPos = Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig);
    vBuffers = Vec_PtrAlloc( nPos );
    for ( i = 0; i < nPos; i++ )
    {
        if ( i % 100 == 0 )
            printf( "%6d finished...\r", i );

        clk2 = Abc_Clock();
        pPart = Saig_ManDupCones( pAig, &i, 1 );
        clkDup += Abc_Clock() - clk2;

        clk2 = Abc_Clock();
        pTemp = Saig_ManDupIsoCanonical( pPart, 0 );
        clkIso += Abc_Clock() - clk2;

        clk2 = Abc_Clock();
        vStr  = Ioa_WriteAigerIntoMemoryStr( pTemp );
        clkAig += Abc_Clock() - clk2;

        Vec_PtrPush( vBuffers, vStr );
        Aig_ManStop( pTemp );
        Aig_ManStop( pPart );
        // remember the output number in nCap (attention: hack!)
        vStr->nCap = i;
    }
//    s_Counter = 0;
    if ( fVerbose )
    {
    Abc_PrintTime( 1, "Duplicate time", clkDup );
    Abc_PrintTime( 1, "Isomorph  time", clkIso );
    Abc_PrintTime( 1, "AIGER     time", clkAig );
    }

    // sort the infos
    clk = Abc_Clock();
    Vec_PtrSort( vBuffers, (int (*)(void))Iso_StoCompareVecStr );

    // create classes
    clk = Abc_Clock();
    vClasses = Vec_PtrAlloc( Saig_ManPoNum(pAig) );
    // start the first class
    Vec_PtrPush( vClasses, (vLevel = Vec_IntAlloc(4)) );
    vPrev = (Vec_Str_t *)Vec_PtrEntry( vBuffers, 0 );
    Vec_IntPush( vLevel, vPrev->nCap );
    // consider other classes
    Vec_PtrForEachEntryStart( Vec_Str_t *, vBuffers, vStr, i, 1 )
    {
        if ( Vec_StrCompareVec(vPrev, vStr) )
            Vec_PtrPush( vClasses, Vec_IntAlloc(4) );
        vLevel = (Vec_Int_t *)Vec_PtrEntryLast( vClasses );
        Vec_IntPush( vLevel, vStr->nCap );
        vPrev = vStr;
    }
    Vec_VecFree( (Vec_Vec_t *)vBuffers );

    if ( fVerbose )
    Abc_PrintTime( 1, "Sorting   time", Abc_Clock() - clk );
//    Abc_PrintTime( 1, "Traversal time", time_Trav );

    // report the results
//    Vec_VecPrintInt( (Vec_Vec_t *)vClasses );
//    printf( "Devided %d outputs into %d cand equiv classes.\n", Saig_ManPoNum(pAig), Vec_PtrSize(vClasses) );
/*
    if ( fVerbose )
    {
        Vec_PtrForEachEntry( Vec_Int_t *, vClasses, vLevel, i )
            if ( Vec_IntSize(vLevel) > 1 )
                printf( "%d ", Vec_IntSize(vLevel) );
            else
                nUnique++;
        printf( " Unique = %d\n", nUnique );
    }
*/

    // canonicize order
    Vec_PtrForEachEntry( Vec_Int_t *, vClasses, vLevel, i )
        Vec_IntSort( vLevel, 0 );
     Vec_VecSortByFirstInt( (Vec_Vec_t *)vClasses, 0 );
       
    // collect the first ones
    vRemain = Vec_IntAlloc( 100 );
    Vec_PtrForEachEntry( Vec_Int_t *, vClasses, vLevel, i )
        Vec_IntPush( vRemain, Vec_IntEntry(vLevel, 0) );

    // derive the resulting AIG
    pPart = Saig_ManDupCones( pAig, Vec_IntArray(vRemain), Vec_IntSize(vRemain) );
    Vec_IntFree( vRemain );

//    return (Vec_Vec_t *)vClasses;
//    Vec_VecFree( (Vec_Vec_t *)vClasses );
    *pvPosEquivs = vClasses;
    return pPart;
}